

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall caffe::ReLUParameter::MergeFrom(ReLUParameter *this,ReLUParameter *from)

{
  uint uVar1;
  LogMessage *other;
  InternalMetadataWithArena *this_00;
  LogFinisher local_c5;
  uint32 cached_has_bits;
  byte local_b1;
  LogMessage local_b0;
  ReLUParameter *local_78;
  ReLUParameter *from_local;
  ReLUParameter *this_local;
  InternalMetadataWithArena *local_60;
  InternalMetadataWithArena *local_58;
  InternalMetadataWithArena *local_30;
  Container *local_28;
  InternalMetadataWithArena *local_20;
  InternalMetadataWithArena *local_18;
  InternalMetadataWithArena *local_10;
  
  local_b1 = 0;
  local_78 = from;
  from_local = this;
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_b0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
               ,0x8b86);
    local_b1 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_b0,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_c5,other);
  }
  if ((local_b1 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_b0);
  }
  this_00 = &this->_internal_metadata_;
  this_local = (ReLUParameter *)&local_78->_internal_metadata_;
  if (((uint)(((InternalMetadataWithArena *)this_local)->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    local_60 = this_00;
    local_58 = (InternalMetadataWithArena *)this_local;
    local_30 = (InternalMetadataWithArena *)this_local;
    local_20 = (InternalMetadataWithArena *)this_local;
    local_18 = (InternalMetadataWithArena *)this_local;
    local_10 = (InternalMetadataWithArena *)this_local;
    if (((uint)(((InternalMetadataWithArena *)this_local)->
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ).ptr_ & 1) == 1) {
      local_28 = google::protobuf::internal::
                 InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                           ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                             *)this_local);
    }
    else {
      local_28 = (Container *)
                 google::protobuf::internal::InternalMetadataWithArena::default_instance();
    }
    google::protobuf::internal::InternalMetadataWithArena::DoMergeFrom
              (this_00,&local_28->unknown_fields);
  }
  uVar1 = (local_78->_has_bits_).has_bits_[0];
  if ((uVar1 & 3) != 0) {
    if ((uVar1 & 1) != 0) {
      this->negative_slope_ = local_78->negative_slope_;
    }
    if ((uVar1 & 2) != 0) {
      this->engine_ = local_78->engine_;
    }
    (this->_has_bits_).has_bits_[0] = uVar1 | (this->_has_bits_).has_bits_[0];
  }
  return;
}

Assistant:

void ReLUParameter::MergeFrom(const ReLUParameter& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:caffe.ReLUParameter)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 3u) {
    if (cached_has_bits & 0x00000001u) {
      negative_slope_ = from.negative_slope_;
    }
    if (cached_has_bits & 0x00000002u) {
      engine_ = from.engine_;
    }
    _has_bits_[0] |= cached_has_bits;
  }
}